

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O2

void uint256_tests::TestFromHex<uint160>(void)

{
  char __rhs;
  long lVar1;
  long lVar2;
  _Alloc_hider _Var3;
  char *pcVar4;
  undefined1 **ppuVar5;
  long lVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator pvVar8;
  iterator in_R9;
  string *psVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  string_view str;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  string_view str_00;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  check_type cVar11;
  string *psVar10;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  optional<uint160> valid_result;
  optional<uint160> local_108;
  undefined1 local_f0 [16];
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c8;
  string invalid_prefix;
  string invalid_chars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> valid_input;
  string valid_64char_input;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&valid_64char_input,
             "0123456789abcdef0123456789ABCDEF0123456789abcdef0123456789ABCDEF",
             (allocator<char> *)&valid_input);
  pcVar4 = &DAT_00000028;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&valid_input,&valid_64char_input,0,0x28);
  str_01._M_str = pcVar4;
  str_01._M_len = (size_t)valid_input._M_dataplus._M_p;
  detail::FromHex<uint160>(&valid_result,(detail *)valid_input._M_string_length,str_01);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x165;
  file.m_begin = (iterator)&local_138;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  invalid_prefix._M_dataplus._M_p._0_1_ =
       valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
       super__Optional_payload_base<uint160>._M_engaged;
  invalid_prefix._M_string_length = 0;
  invalid_prefix.field_2._M_allocated_capacity = 0;
  invalid_chars.field_2._8_8_ = local_d8;
  local_d8._0_8_ = "valid_result";
  local_d8._8_8_ = (long)"valid_result" + 0xc;
  invalid_chars._M_string_length._0_1_ = 0;
  invalid_chars._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  invalid_chars.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_150 = "";
  pvVar7 = (iterator)0x2;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&invalid_prefix,(lazy_ostream *)&invalid_chars,2,0,WARN,_cVar11,
             (size_t)&local_158,0x165);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&invalid_prefix.field_2._M_allocated_capacity);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x166;
  file_00.m_begin = (iterator)&local_168;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  invalid_chars._M_string_length._0_1_ = 0;
  invalid_chars._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  invalid_chars.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_chars.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_180 = "";
  base_blob<160u>::ToString_abi_cxx11_(&invalid_prefix,&valid_result);
  psVar10 = (string *)local_d8;
  str._M_str = valid_input._M_dataplus._M_p;
  str._M_len = valid_input._M_string_length;
  ToLower_abi_cxx11_(psVar10,str);
  pvVar7 = (iterator)0x2;
  psVar9 = &invalid_prefix;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&invalid_chars,&local_188,0x166,1,2,psVar9,"valid_result->ToString()",psVar10,
             "ToLower(valid_input)");
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)&invalid_prefix);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_190 = "";
  ppuVar5 = &local_1a8;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x16a;
  file_01.m_begin = (iterator)&local_198;
  msg_01.m_end = (iterator)psVar9;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar5,msg_01);
  str_02._M_str = (char *)ppuVar5;
  str_02._M_len = (size_t)"";
  detail::FromHex<uint160>((optional<uint160> *)local_d8,(detail *)0x0,str_02);
  invalid_prefix._M_dataplus._M_p =
       (pointer)(CONCAT71(invalid_prefix._M_dataplus._M_p._1_7_,aStack_c8._M_local_buf[4]) ^ 1);
  invalid_prefix._M_string_length = 0;
  invalid_prefix.field_2._M_allocated_capacity = 0;
  valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._0_8_ = anon_var_dwarf_13772c3;
  valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._8_8_ = (long)"!T::FromHex(\"\")" + 0xf;
  invalid_chars._M_string_length._0_1_ = 0;
  invalid_chars._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  invalid_chars.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1b0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  invalid_chars.field_2._8_8_ = &valid_result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&invalid_prefix,(lazy_ostream *)&invalid_chars,1,0,WARN,
             (check_type)psVar10,(size_t)&local_1b8,0x16a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&invalid_prefix.field_2._M_allocated_capacity);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1c0 = "";
  ppuVar5 = &local_1d8;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x16b;
  file_02.m_begin = (iterator)&local_1c8;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar5,msg_02);
  str_03._M_str = (char *)ppuVar5;
  str_03._M_len = (size_t)"0";
  detail::FromHex<uint160>((optional<uint160> *)local_d8,(detail *)&DAT_00000001,str_03);
  invalid_prefix._M_dataplus._M_p =
       (pointer)(CONCAT71(invalid_prefix._M_dataplus._M_p._1_7_,aStack_c8._M_local_buf[4]) ^ 1);
  invalid_prefix._M_string_length = 0;
  invalid_prefix.field_2._M_allocated_capacity = 0;
  valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._0_8_ = anon_var_dwarf_13772d0;
  valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._8_8_ = (long)"!T::FromHex(\"0\")" + 0x10;
  invalid_chars._M_string_length._0_1_ = 0;
  invalid_chars._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  invalid_chars.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1e0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  invalid_chars.field_2._8_8_ = &valid_result;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&invalid_prefix,(lazy_ostream *)&invalid_chars,1,0,WARN,
             (check_type)psVar10,(size_t)&local_1e8,0x16b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&invalid_prefix.field_2._M_allocated_capacity);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x16c;
  file_03.m_begin = (iterator)&local_1f8;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_208,
             msg_03);
  pcVar4 = (char *)0x14;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&invalid_chars,&valid_input,0,0x14);
  str_04._M_str = pcVar4;
  str_04._M_len = (size_t)invalid_chars._M_dataplus._M_p;
  detail::FromHex<uint160>
            (&valid_result,
             (detail *)
             CONCAT71(invalid_chars._M_string_length._1_7_,
                      (undefined1)invalid_chars._M_string_length),str_04);
  local_d8._0_8_ =
       CONCAT71(local_d8._1_7_,
                valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
                super__Optional_payload_base<uint160>._M_engaged) ^ 1;
  local_d8._8_8_ = 0;
  aStack_c8._M_allocated_capacity = 0;
  local_f0._0_8_ = "!T::FromHex(valid_input.substr(0, num_chars / 2))";
  local_f0._8_8_ = (long)"!T::FromHex(valid_input.substr(0, num_chars / 2))" + 0x31;
  invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
  invalid_prefix._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_210 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  invalid_prefix.field_2._8_8_ = local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_d8,(lazy_ostream *)&invalid_prefix,1,0,WARN,
             (check_type)psVar10,(size_t)&local_218,0x16c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_c8._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&invalid_chars);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x16d;
  file_04.m_begin = (iterator)&local_228;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_238,
             msg_04);
  pcVar4 = (char *)0x27;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&invalid_chars,&valid_input,0,0x27);
  str_05._M_str = pcVar4;
  str_05._M_len = (size_t)invalid_chars._M_dataplus._M_p;
  detail::FromHex<uint160>
            (&valid_result,
             (detail *)
             CONCAT71(invalid_chars._M_string_length._1_7_,
                      (undefined1)invalid_chars._M_string_length),str_05);
  local_d8._0_8_ =
       CONCAT71(local_d8._1_7_,
                valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
                super__Optional_payload_base<uint160>._M_engaged) ^ 1;
  local_d8._8_8_ = 0;
  aStack_c8._M_allocated_capacity = 0;
  local_f0._0_8_ = "!T::FromHex(valid_input.substr(0, num_chars - 1))";
  local_f0._8_8_ = (long)"!T::FromHex(valid_input.substr(0, num_chars - 1))" + 0x31;
  invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
  invalid_prefix._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_240 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  invalid_prefix.field_2._8_8_ = local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_d8,(lazy_ostream *)&invalid_prefix,1,0,WARN,
             (check_type)psVar10,(size_t)&local_248,0x16d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_c8._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&invalid_chars);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_250 = "";
  ppuVar5 = &local_268;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x16e;
  file_05.m_begin = (iterator)&local_258;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)ppuVar5,msg_05);
  std::operator+(&invalid_chars,&valid_input,"0");
  str_06._M_str = (char *)ppuVar5;
  str_06._M_len = (size_t)invalid_chars._M_dataplus._M_p;
  detail::FromHex<uint160>
            (&valid_result,
             (detail *)
             CONCAT71(invalid_chars._M_string_length._1_7_,
                      (undefined1)invalid_chars._M_string_length),str_06);
  local_d8._0_8_ =
       CONCAT71(local_d8._1_7_,
                valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
                super__Optional_payload_base<uint160>._M_engaged) ^ 1;
  local_d8._8_8_ = 0;
  aStack_c8._M_allocated_capacity = 0;
  local_f0._0_8_ = "!T::FromHex(valid_input + \"0\")";
  local_f0._8_8_ = (long)"!T::FromHex(valid_input + \"0\")" + 0x1e;
  invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
  invalid_prefix._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_270 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  invalid_prefix.field_2._8_8_ = local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_d8,(lazy_ostream *)&invalid_prefix,1,0,WARN,
             (check_type)psVar10,(size_t)&local_278,0x16e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_c8._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&invalid_chars);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalid_chars,
             " !\"#$%&\'()*+,-./:;<=>?@GHIJKLMNOPQRSTUVWXYZ[\\]^_`ghijklmnopqrstuvwxyz{|}~",
             (allocator<char> *)&invalid_prefix);
  _Var3 = invalid_chars._M_dataplus;
  lVar2 = CONCAT71(invalid_chars._M_string_length._1_7_,(undefined1)invalid_chars._M_string_length);
  for (lVar6 = 0; lVar2 != lVar6; lVar6 = lVar6 + 1) {
    __rhs = _Var3._M_p[lVar6];
    local_288 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_280 = "";
    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x174;
    file_06.m_begin = (iterator)&local_288;
    msg_06.m_end = pvVar8;
    msg_06.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_298,
               msg_06);
    pcVar4 = (char *)0x27;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
               &valid_input,0,0x27);
    std::operator+(&invalid_prefix,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   __rhs);
    str_07._M_str = pcVar4;
    str_07._M_len = (size_t)invalid_prefix._M_dataplus._M_p;
    detail::FromHex<uint160>(&local_108,(detail *)invalid_prefix._M_string_length,str_07);
    local_f0._0_8_ =
         CONCAT71(local_f0._1_7_,
                  local_108.super__Optional_base<uint160,_true,_true>._M_payload.
                  super__Optional_payload_base<uint160>._M_engaged) ^ 1;
    local_f0._8_8_ = (element_type *)0x0;
    uStack_e0 = (sp_counted_base *)0x0;
    local_2a8 = "!T::FromHex(valid_input.substr(0, num_chars - 1) + c)";
    local_2a0 = "";
    valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
    super__Optional_payload_base<uint160>._M_payload._8_8_ =
         valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
         super__Optional_payload_base<uint160>._M_payload._8_8_ & 0xffffffffffffff00;
    valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
    super__Optional_payload_base<uint160>._M_payload._0_8_ = &PTR__lazy_ostream_011481f0;
    stack0xfffffffffffffee8 = boost::unit_test::lazy_ostream::inst;
    local_2b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_2b0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_f0,(lazy_ostream *)&valid_result,1,0,WARN,
               (check_type)psVar10,(size_t)&local_2b8,0x174);
    boost::detail::shared_count::~shared_count((shared_count *)&uStack_e0);
    std::__cxx11::string::~string((string *)&invalid_prefix);
    std::__cxx11::string::~string((string *)local_d8);
  }
  std::operator+(&invalid_prefix,"0x",&valid_input);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2c0 = "";
  ppuVar5 = &local_2d8;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x178;
  file_07.m_begin = (iterator)&local_2c8;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)ppuVar5,msg_07);
  str_08._M_str = (char *)ppuVar5;
  str_08._M_len = (size_t)invalid_prefix._M_dataplus._M_p;
  detail::FromHex<uint160>((optional<uint160> *)local_f0,(detail *)&DAT_00000028,str_08);
  valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._0_8_ =
       CONCAT71(valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
                super__Optional_payload_base<uint160>._M_payload._1_7_,uStack_e0._4_1_) ^ 1;
  valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._8_8_ = 0;
  stack0xfffffffffffffee8 = (undefined1 *)0x0;
  local_108.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._0_8_ =
       "!T::FromHex(std::string_view(invalid_prefix.data(), num_chars))";
  local_108.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._8_8_ =
       (long)"!T::FromHex(std::string_view(invalid_prefix.data(), num_chars))" + 0x3f;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_c8._8_8_ = &local_108;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2e0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&valid_result,(lazy_ostream *)local_d8,1,0,WARN,(check_type)psVar10
             ,(size_t)&local_2e8,0x178);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
                     super__Optional_payload_base<uint160>._M_payload._M_value.super_base_blob<160U>
                     .m_data + 0x10));
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2f0 = "";
  ppuVar5 = &local_308;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x179;
  file_08.m_begin = (iterator)&local_2f8;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)ppuVar5,msg_08);
  str_09._M_str = (char *)ppuVar5;
  str_09._M_len = (size_t)invalid_prefix._M_dataplus._M_p;
  detail::FromHex<uint160>
            ((optional<uint160> *)local_f0,(detail *)invalid_prefix._M_string_length,str_09);
  valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._0_8_ =
       CONCAT71(valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
                super__Optional_payload_base<uint160>._M_payload._1_7_,uStack_e0._4_1_) ^ 1;
  valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._8_8_ = 0;
  stack0xfffffffffffffee8 = (undefined1 *)0x0;
  local_108.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._0_8_ = "!T::FromHex(invalid_prefix)";
  local_108.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._8_8_ =
       (long)"!T::FromHex(invalid_prefix)" + 0x1b;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_c8._8_8_ = &local_108;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_310 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&valid_result,(lazy_ostream *)local_d8,1,0,WARN,(check_type)psVar10
             ,(size_t)&local_318,0x179);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
                     super__Optional_payload_base<uint160>._M_payload._M_value.super_base_blob<160U>
                     .m_data + 0x10));
  std::__cxx11::string::~string((string *)&invalid_prefix);
  std::__cxx11::string::~string((string *)&invalid_chars);
  std::operator+(&invalid_chars,&valid_64char_input,"0123");
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_320 = "";
  ppuVar5 = &local_338;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x17e;
  file_09.m_begin = (iterator)&local_328;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)ppuVar5,msg_09);
  invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
  invalid_prefix._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_prefix.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_340 = "";
  str_10._M_str = (char *)ppuVar5;
  str_10._M_len = (size_t)invalid_chars._M_dataplus._M_p;
  detail::FromHex<uint160>((optional<uint160> *)local_f0,(detail *)&DAT_00000028,str_10);
  if (uStack_e0._4_1_ == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    base_blob<160u>::ToString_abi_cxx11_((string *)local_d8,local_f0);
    psVar10 = (string *)&valid_result;
    str_00._M_str = valid_input._M_dataplus._M_p;
    str_00._M_len = valid_input._M_string_length;
    ToLower_abi_cxx11_(psVar10,str_00);
    pvVar8 = (iterator)0x2;
    pvVar7 = local_d8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&invalid_prefix,&local_348,0x17e,1,2,pvVar7,
               "T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString()",psVar10
               ,"ToLower(valid_input)");
    std::__cxx11::string::~string((string *)&valid_result);
    std::__cxx11::string::~string((string *)local_d8);
    local_358 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_350 = "";
    ppuVar5 = &local_368;
    local_368 = &boost::unit_test::basic_cstring<char_const>::null;
    local_360 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x17f;
    file_10.m_begin = (iterator)&local_358;
    msg_10.m_end = pvVar7;
    msg_10.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)ppuVar5,msg_10
              );
    str_11._M_str = (char *)ppuVar5;
    str_11._M_len = (size_t)invalid_chars._M_dataplus._M_p;
    detail::FromHex<uint160>(&valid_result,(detail *)0x27,str_11);
    local_d8._0_8_ =
         CONCAT71(local_d8._1_7_,
                  valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
                  super__Optional_payload_base<uint160>._M_engaged) ^ 1;
    local_d8._8_8_ = 0;
    aStack_c8._M_allocated_capacity = 0;
    local_f0._0_8_ = "!T::FromHex(std::string_view(chars_68.data(), num_chars - 1))";
    local_f0._8_8_ = (long)"!T::FromHex(std::string_view(chars_68.data(), num_chars - 1))" + 0x3d;
    invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
    invalid_prefix._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
    invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_378 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_370 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    invalid_prefix.field_2._8_8_ = local_f0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_d8,(lazy_ostream *)&invalid_prefix,1,0,WARN,
               (check_type)psVar10,(size_t)&local_378,0x17f);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_c8._M_allocated_capacity);
    local_388 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_380 = "";
    ppuVar5 = &local_398;
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x180;
    file_11.m_begin = (iterator)&local_388;
    msg_11.m_end = pvVar8;
    msg_11.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)ppuVar5,msg_11
              );
    str_12._M_str = (char *)ppuVar5;
    str_12._M_len = (size_t)invalid_chars._M_dataplus._M_p;
    detail::FromHex<uint160>(&valid_result,(detail *)0x29,str_12);
    local_d8._0_8_ =
         CONCAT71(local_d8._1_7_,
                  valid_result.super__Optional_base<uint160,_true,_true>._M_payload.
                  super__Optional_payload_base<uint160>._M_engaged) ^ 1;
    local_d8._8_8_ = 0;
    aStack_c8._M_allocated_capacity = 0;
    local_f0._0_8_ = "!T::FromHex(std::string_view(chars_68.data(), num_chars + 1))";
    local_f0._8_8_ = (long)"!T::FromHex(std::string_view(chars_68.data(), num_chars + 1))" + 0x3d;
    invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
    invalid_prefix._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
    invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_3a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_3a0 = "";
    invalid_prefix.field_2._8_8_ = local_f0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_d8,(lazy_ostream *)&invalid_prefix,1,0,WARN,
               (check_type)psVar10,(size_t)&local_3a8,0x180);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_c8._M_allocated_capacity);
    std::__cxx11::string::~string((string *)&invalid_chars);
    std::__cxx11::string::~string((string *)&valid_input);
    std::__cxx11::string::~string((string *)&valid_64char_input);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void TestFromHex()
{
    constexpr unsigned int num_chars{T::size() * 2};
    static_assert(num_chars <= 64); // this test needs to be modified to allow for more than 64 hex chars
    const std::string valid_64char_input{"0123456789abcdef0123456789ABCDEF0123456789abcdef0123456789ABCDEF"};
    const auto valid_input{valid_64char_input.substr(0, num_chars)};
    {
        // check that lower and upper case hex characters are accepted
        auto valid_result{T::FromHex(valid_input)};
        BOOST_REQUIRE(valid_result);
        BOOST_CHECK_EQUAL(valid_result->ToString(), ToLower(valid_input));
    }
    {
        // check that only strings of size num_chars are accepted
        BOOST_CHECK(!T::FromHex(""));
        BOOST_CHECK(!T::FromHex("0"));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars / 2)));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1)));
        BOOST_CHECK(!T::FromHex(valid_input + "0"));
    }
    {
        // check that non-hex characters are not accepted
        std::string invalid_chars{R"( !"#$%&'()*+,-./:;<=>?@GHIJKLMNOPQRSTUVWXYZ[\]^_`ghijklmnopqrstuvwxyz{|}~)"};
        for (auto c : invalid_chars) {
            BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1) + c));
        }
        // 0x prefixes are invalid
        std::string invalid_prefix{"0x" + valid_input};
        BOOST_CHECK(!T::FromHex(std::string_view(invalid_prefix.data(), num_chars)));
        BOOST_CHECK(!T::FromHex(invalid_prefix));
    }
    {
        // check that string_view length is respected
        std::string chars_68{valid_64char_input + "0123"};
        BOOST_CHECK_EQUAL(T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString(), ToLower(valid_input));
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars - 1))); // too short
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars + 1))); // too long
    }
}